

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_ordinaryFunction_apply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t right;
  sysbvm_bitflags_t sVar2;
  sysbvm_context_t **function_00;
  anon_struct_8_1_3a3b9956 gcFrame;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_context_t *local_80;
  sysbvm_stackFrameRecord_t local_78;
  undefined8 local_68;
  sysbvm_context_t **local_60;
  sysbvm_stackFrameRecord_t local_50;
  size_t local_40;
  sysbvm_tuple_t *local_38;
  
  function_00 = (sysbvm_context_t **)function;
  if (*(long *)(function + 0x40) != 0) {
    if (*(long *)(function + 0x40) == 0x5f) {
      sVar1 = sysbvm_string_createWithCString
                        (context,"Applying function with cyclic pending lazy analysis process ");
      right = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(function + 0x10));
      sVar1 = sysbvm_string_concat(context,sVar1,right);
      sysbvm_errorWithMessageTuple(sVar1);
    }
    function_00 = &local_80;
    local_78.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_78.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_78._12_4_ = 0;
    local_68 = 1;
    local_80 = (sysbvm_context_t *)function;
    local_60 = function_00;
    sysbvm_stackFrame_pushRecord(&local_78);
    local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_40 = argumentCount;
    local_38 = arguments;
    sysbvm_stackFrame_pushRecord(&local_50);
    sysbvm_function_ensureAnalysis(context,(sysbvm_function_t **)function_00);
    function = (sysbvm_tuple_t)local_80;
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_78);
  }
  sVar2 = sysbvm_function_getFlags((sysbvm_context_t *)function,(sysbvm_tuple_t)function_00);
  if (((uint)sVar2 >> 9 & 1) == 0) {
    sVar1 = sysbvm_ordinaryFunction_directApply
                      (context,function,argumentCount,arguments,applicationFlags);
  }
  else {
    sVar1 = sysbvm_ordinaryFunction_memoizedApply
                      (context,function,argumentCount,arguments,applicationFlags);
  }
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_apply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    // Make sure the closure with lazy analysis is done and reified.
    sysbvm_function_t* functionObject = (sysbvm_function_t*)function;
    if(functionObject->captureEnvironment)
    {
        if(functionObject->captureEnvironment == SYSBVM_PENDING_MEMOIZATION_VALUE)
        {
            sysbvm_tuple_t errorTuple = sysbvm_string_concat(context,
                sysbvm_string_createWithCString(context, "Applying function with cyclic pending lazy analysis process "),
                sysbvm_tuple_printString(context, functionObject->super.name)
            );
            sysbvm_errorWithMessageTuple(errorTuple);
        }

        struct {
            sysbvm_tuple_t function;
        } gcFrame = {
            .function = function
        };
        SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

        sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
            .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
            .rootCount = argumentCount,
            .roots = arguments
        };
        sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

        sysbvm_function_ensureAnalysis(context, (sysbvm_function_t**)&gcFrame.function);

        function = gcFrame.function;
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    }

    if(sysbvm_function_isMemoized(context, function))
        return sysbvm_ordinaryFunction_memoizedApply(context, function, argumentCount, arguments, applicationFlags);
    return sysbvm_ordinaryFunction_directApply(context, function, argumentCount, arguments, applicationFlags);
}